

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O0

void ENUMS_EQUAL_INTWithUnscopedEnumTestMethod_(void)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_68;
  SimpleString local_58;
  undefined4 local_48;
  undefined4 local_44;
  int actual_underlying_value_1;
  int expected_underlying_value_1;
  undefined4 local_10;
  undefined4 local_c;
  int actual_underlying_value;
  int expected_underlying_value;
  
  local_c = 1;
  local_10 = 1;
  pUVar1 = UtestShell::getCurrent();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,0,0,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x4fb,pTVar4);
  local_44 = 1;
  local_48 = 0;
  pUVar1 = UtestShell::getCurrent();
  StringFrom((int)&local_58);
  pcVar2 = SimpleString::asCharString(&local_58);
  StringFrom((int)&local_68);
  pcVar3 = SimpleString::asCharString(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar2,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x4fc,pTVar4);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

static void ENUMS_EQUAL_INTWithUnscopedEnumTestMethod_()
{
    ENUMS_EQUAL_INT(UNSCOPED_ENUM_B, UNSCOPED_ENUM_B);
    ENUMS_EQUAL_INT(UNSCOPED_ENUM_B, UNSCOPED_ENUM_A);
}